

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verify.cpp
# Opt level: O2

TestReturnValue __thiscall
embree::DisableAndDetachGeometryTest::run
          (DisableAndDetachGeometryTest *this,VerifyApplication *state,bool silent)

{
  byte bVar1;
  RTCError code;
  RTCDevice userPtr;
  int sse2;
  RTCBuildQuality quality;
  size_t j;
  long lVar2;
  size_t i;
  ulong uVar3;
  RTCDeviceRef device;
  RTCGeometry hgeom [4];
  uint geom [4];
  VerifyScene scene;
  undefined1 local_248 [16];
  undefined1 local_238 [16];
  RTCRayHit rh_1;
  RTCRayHit rh;
  undefined1 local_168 [16];
  string cfg;
  RTCRayHit rh_3;
  RTCRayHit rh_2;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&rh,
                 &(state->super_Application).rtcore,",isa=");
  stringOfISA_abi_cxx11_((string *)&rh_1,(embree *)(ulong)(uint)(this->super_Test).sse2,sse2);
  std::operator+(&cfg,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&rh,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&rh_1);
  std::__cxx11::string::~string((string *)&rh_1);
  std::__cxx11::string::~string((string *)&rh);
  userPtr = (RTCDevice)rtcNewDevice(cfg._M_dataplus._M_p);
  device.device = userPtr;
  code = rtcGetDeviceError();
  errorHandler(userPtr,code,(char *)0x0);
  VerifyScene::VerifyScene(&scene,&device,this->sflags);
  AssertNoError(device.device);
  quality = (int)this + 0x3c;
  local_48 = 0xbf800000;
  uStack_40 = 0xbf800000;
  rh.ray.org_z = 0.0;
  rh.ray.tnear = 0.0;
  rh.ray.dir_x = 0.0;
  rh.ray.dir_y = 0.0;
  rh.ray.dir_z = 0.0;
  rh.ray.time = 0.0;
  VerifyScene::addSphere
            ((VerifyScene *)hgeom,(RandomSampler *)&scene,quality,(Vec3fa *)0x1,1.0,
             (size_t)&local_48,0x32,(avector<Vec3fa> *)0xffffffffffffffff);
  geom[0] = (uint)hgeom[0];
  local_58 = 0xbf800000;
  uStack_50 = 0x3f800000;
  rh_1.ray.org_z = 0.0;
  rh_1.ray.tnear = 0.0;
  rh_1.ray.dir_x = 0.0;
  rh_1.ray.dir_y = 0.0;
  rh_1.ray.dir_z = 0.0;
  rh_1.ray.time = 0.0;
  VerifyScene::addQuadSphere
            ((VerifyScene *)local_238,(RandomSampler *)&scene,quality,(Vec3fa *)0x1,1.0,
             (size_t)&local_58,0x32,(avector<Vec3fa> *)0xffffffffffffffff);
  geom[1] = local_238._0_4_;
  local_68 = 0x3f800000;
  uStack_60 = 0xbf800000;
  rh_2.ray.org_z = 0.0;
  rh_2.ray.tnear = 0.0;
  rh_2.ray.dir_x = 0.0;
  rh_2.ray.dir_y = 0.0;
  rh_2.ray.dir_z = 0.0;
  rh_2.ray.time = 0.0;
  VerifyScene::addSubdivSphere
            ((VerifyScene *)local_248,(RandomSampler *)&scene,quality,(Vec3fa *)0x1,1.0,
             (size_t)&local_68,4.0,5,(avector<Vec3fa> *)0xffffffffffffffff);
  geom[2] = local_248._0_4_;
  local_78 = 0x3f800000;
  uStack_70 = 0x3f800000;
  rh_3.ray.org_z = 0.0;
  rh_3.ray.tnear = 0.0;
  rh_3.ray.dir_x = 0.0;
  rh_3.ray.dir_y = 0.0;
  rh_3.ray.dir_z = 0.0;
  rh_3.ray.time = 0.0;
  VerifyScene::addHair
            ((VerifyScene *)local_168,(RandomSampler *)&scene,quality,(Vec3fa *)0x1,1.0,1.0,
             (size_t)&local_78,(avector<Vec3fa> *)0x1);
  geom[3] = local_168._0_4_;
  std::pair<unsigned_int,_embree::Ref<embree::SceneGraph::Node>_>::~pair
            ((pair<unsigned_int,_embree::Ref<embree::SceneGraph::Node>_> *)local_168);
  alignedFree((void *)rh_3.ray._24_8_);
  std::pair<unsigned_int,_embree::Ref<embree::SceneGraph::Node>_>::~pair
            ((pair<unsigned_int,_embree::Ref<embree::SceneGraph::Node>_> *)local_248);
  alignedFree((void *)rh_2.ray._24_8_);
  std::pair<unsigned_int,_embree::Ref<embree::SceneGraph::Node>_>::~pair
            ((pair<unsigned_int,_embree::Ref<embree::SceneGraph::Node>_> *)local_238);
  alignedFree((void *)rh_1.ray._24_8_);
  std::pair<unsigned_int,_embree::Ref<embree::SceneGraph::Node>_>::~pair
            ((pair<unsigned_int,_embree::Ref<embree::SceneGraph::Node>_> *)hgeom);
  alignedFree((void *)rh.ray._24_8_);
  hgeom[0] = (RTCGeometry)rtcGetGeometry(scene.scene.scene,(uint)hgeom[0]);
  hgeom[1] = (RTCGeometry)rtcGetGeometry(scene.scene.scene,local_238._0_4_);
  hgeom[2] = (RTCGeometry)rtcGetGeometry(scene.scene.scene,local_248._0_4_);
  hgeom[3] = (RTCGeometry)rtcGetGeometry(scene.scene.scene,local_168._0_4_);
  AssertNoError(device.device);
  for (lVar2 = 0; lVar2 != 4; lVar2 = lVar2 + 1) {
    rtcEnableGeometry(hgeom[lVar2]);
  }
  rtcCommitScene(scene.scene.scene);
  AssertNoError(device.device);
  bVar1 = 1;
  uVar3 = 0;
  do {
    if (uVar3 == 5) {
      AssertNoError(device.device);
      VerifyScene::~VerifyScene(&scene);
      RTCDeviceRef::~RTCDeviceRef(&device);
      std::__cxx11::string::~string((string *)&cfg);
      return (uint)bVar1;
    }
    rh.ray.id = 0xffffffff;
    rh.hit.v = 0.0;
    rh.hit.Ng_x = 0.0;
    rh.hit.Ng_y = 0.0;
    rh.hit.Ng_z = 0.0;
    rh.hit.u = 0.0;
    rh.ray.org_x = -1.0;
    rh.ray.org_y = 10.0;
    rh.ray.org_z = -1.0;
    rh.ray.tnear = 0.0;
    rh.ray.tfar = INFINITY;
    rh.ray.mask = 0xffffffff;
    rh.ray.dir_x = 0.0;
    rh.ray.dir_y = -1.0;
    rh.ray.dir_z = 0.0;
    rh.ray.time = 0.0;
    rh_1.ray.id = 0xffffffff;
    rh.hit.primID = 0xffffffff;
    rh.hit.geomID = 0xffffffff;
    rh.hit.instID[0] = 0xffffffff;
    rh.hit.instPrimID[0] = 0xffffffff;
    rh_1.hit.v = 0.0;
    rh_1.hit.Ng_x = 0.0;
    rh_1.hit.Ng_y = 0.0;
    rh_1.hit.Ng_z = 0.0;
    rh_1.hit.u = 0.0;
    rh_1.ray.org_x = -1.0;
    rh_1.ray.org_y = 10.0;
    rh_1.ray.org_z = 1.0;
    rh_1.ray.tnear = 0.0;
    rh_1.ray.tfar = INFINITY;
    rh_1.ray.mask = 0xffffffff;
    rh_1.ray.dir_x = 0.0;
    rh_1.ray.dir_y = -1.0;
    rh_1.ray.dir_z = 0.0;
    rh_1.ray.time = 0.0;
    rh_1.hit.primID = 0xffffffff;
    rh_1.hit.geomID = 0xffffffff;
    rh_1.hit.instID[0] = 0xffffffff;
    rh_1.hit.instPrimID[0] = 0xffffffff;
    rh_2.ray.id = 0xffffffff;
    rh_2.hit.Ng_x = 0.0;
    rh_2.hit.Ng_y = 0.0;
    rh_2.hit.Ng_z = 0.0;
    rh_2.hit.u = 0.0;
    rh_2.hit.v = 0.0;
    rh_2.ray.org_x = 1.0;
    rh_2.ray.org_y = 10.0;
    rh_2.ray.org_z = -1.0;
    rh_2.ray.tnear = 0.0;
    rh_2.ray.tfar = INFINITY;
    rh_2.ray.mask = 0xffffffff;
    rh_2.ray.dir_x = 0.0;
    rh_2.ray.dir_y = -1.0;
    rh_2.ray.dir_z = 0.0;
    rh_2.ray.time = 0.0;
    rh_2.hit.primID = 0xffffffff;
    rh_2.hit.geomID = 0xffffffff;
    rh_2.hit.instID[0] = 0xffffffff;
    rh_2.hit.instPrimID[0] = 0xffffffff;
    rh_3.ray.id = 0xffffffff;
    rh_3.hit.Ng_x = 0.0;
    rh_3.hit.Ng_y = 0.0;
    rh_3.hit.Ng_z = 0.0;
    rh_3.hit.u = 0.0;
    rh_3.hit.v = 0.0;
    rh_3.ray.org_x = 1.0;
    rh_3.ray.org_y = 10.0;
    rh_3.ray.org_z = 1.0;
    rh_3.ray.tnear = 0.0;
    rh_3.ray.tfar = INFINITY;
    rh_3.ray.mask = 0xffffffff;
    rh_3.ray.dir_x = 0.0;
    rh_3.ray.dir_y = -1.0;
    rh_3.ray.dir_z = 0.0;
    rh_3.ray.time = 0.0;
    rh_3.hit.primID = 0xffffffff;
    rh_3.hit.geomID = 0xffffffff;
    rh_3.hit.instID[0] = 0xffffffff;
    rh_3.hit.instPrimID[0] = 0xffffffff;
    rtcIntersect1(scene.scene.scene,&rh,0);
    rtcIntersect1(scene.scene.scene,&rh_1,0);
    rtcIntersect1(scene.scene.scene,&rh_2,0);
    rtcIntersect1(scene.scene.scene,&rh_3,0);
    if (rh.hit.geomID == -(uint)(uVar3 != 0)) {
      if (((rh_1.hit.geomID != ((uVar3 < 2) - 1 | 1)) || (rh_2.hit.geomID != ((uVar3 < 3) - 1 | 2)))
         || (rh_3.hit.geomID != (uint)(uVar3 != 4) * 4 - 1)) goto LAB_00139292;
      std::operator<<((ostream *)&std::cout,".");
      std::ostream::flush();
    }
    else {
LAB_00139292:
      std::operator<<((ostream *)&std::cout,"!");
      std::ostream::flush();
      bVar1 = 0;
    }
    if (uVar3 != 4) {
      rtcDisableGeometry(hgeom[uVar3]);
      AssertNoError(device.device);
      rtcDetachGeometry(scene.scene.scene,geom[uVar3]);
      AssertNoError(device.device);
      rtcCommitScene(scene.scene.scene);
      AssertNoError(device.device);
    }
    uVar3 = uVar3 + 1;
  } while( true );
}

Assistant:

VerifyApplication::TestReturnValue run(VerifyApplication* state, bool silent)
    {
      std::string cfg = state->rtcore + ",isa="+stringOfISA(isa);
      RTCDeviceRef device = rtcNewDevice(cfg.c_str());
      errorHandler(nullptr,rtcGetDeviceError(device));
      VerifyScene scene(device,sflags);
      AssertNoError(device);
      unsigned geom[] = {
        scene.addSphere      (sampler,RTC_BUILD_QUALITY_MEDIUM,Vec3fa(-1,0,-1),1.0f,50).first,
        scene.addQuadSphere  (sampler,RTC_BUILD_QUALITY_MEDIUM,Vec3fa(-1,0,+1),1.0f,50).first,
        scene.addSubdivSphere(sampler,RTC_BUILD_QUALITY_MEDIUM,Vec3fa(+1,0,-1),1.0f,5,4).first,
        scene.addHair        (sampler,RTC_BUILD_QUALITY_MEDIUM,Vec3fa(+1,0,+1),1.0f,1.0f,1).first,
      };
      RTCGeometry hgeom[] = {
        rtcGetGeometry(scene,geom[0]),
        rtcGetGeometry(scene,geom[1]),
        rtcGetGeometry(scene,geom[2]),
        rtcGetGeometry(scene,geom[3]),
      };
      AssertNoError(device);

      for (size_t j=0; j<4; ++j)
      {
        rtcEnableGeometry(hgeom[j]);
      }
      rtcCommitScene (scene);
      AssertNoError(device);

      bool allOk = true;
      for (size_t i=0; i<5; i++)
      {
        RTCRayHit ray0 = makeRay(Vec3fa(-1,10,-1),Vec3fa(0,-1,0));
        RTCRayHit ray1 = makeRay(Vec3fa(-1,10,+1),Vec3fa(0,-1,0));
        RTCRayHit ray2 = makeRay(Vec3fa(+1,10,-1),Vec3fa(0,-1,0));
        RTCRayHit ray3 = makeRay(Vec3fa(+1,10,+1),Vec3fa(0,-1,0));
        rtcIntersect1(scene,&ray0);
        rtcIntersect1(scene,&ray1);
        rtcIntersect1(scene,&ray2);
        rtcIntersect1(scene,&ray3);
        bool ok0 = i<=0 ? ray0.hit.geomID == 0 : ray0.hit.geomID == RTC_INVALID_GEOMETRY_ID;
        bool ok1 = i<=1 ? ray1.hit.geomID == 1 : ray1.hit.geomID == RTC_INVALID_GEOMETRY_ID;
        bool ok2 = i<=2 ? ray2.hit.geomID == 2 : ray2.hit.geomID == RTC_INVALID_GEOMETRY_ID;
        bool ok3 = i<=3 ? ray3.hit.geomID == 3 : ray3.hit.geomID == RTC_INVALID_GEOMETRY_ID;
        if (!ok0 || !ok1 || !ok2 || !ok3)
        {
          std::cout << "!" << std::flush;
          allOk = false;
        }
        else
        {
          std::cout << "." << std::flush;
        }

        if (i<4)
        {
          rtcDisableGeometry(hgeom[i]);
          AssertNoError(device);
          rtcDetachGeometry(scene,geom[i]);
          AssertNoError(device);
          rtcCommitScene (scene);
          AssertNoError(device);
        }
      }
      AssertNoError(device);

      if (allOk)
        return VerifyApplication::PASSED;
      else
        return VerifyApplication::FAILED;
    }